

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O2

Matrix3x3 * CMU462::operator*(Matrix3x3 *__return_storage_ptr__,double c,Matrix3x3 *A)

{
  double dVar1;
  Matrix3x3 *cA;
  
  dVar1 = A->entries[0].y;
  __return_storage_ptr__->entries[0].x = A->entries[0].x * c;
  __return_storage_ptr__->entries[0].y = dVar1 * c;
  dVar1 = A->entries[1].x;
  __return_storage_ptr__->entries[0].z = A->entries[0].z * c;
  __return_storage_ptr__->entries[1].x = dVar1 * c;
  dVar1 = A->entries[1].z;
  __return_storage_ptr__->entries[1].y = A->entries[1].y * c;
  __return_storage_ptr__->entries[1].z = dVar1 * c;
  dVar1 = A->entries[2].y;
  __return_storage_ptr__->entries[2].x = A->entries[2].x * c;
  __return_storage_ptr__->entries[2].y = dVar1 * c;
  __return_storage_ptr__->entries[2].z = c * A->entries[2].z;
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 operator*( double c, const Matrix3x3& A ) {

    Matrix3x3 cA;
    const double* Aij = (const double*) &A;
    double* cAij = (double*) &cA;

    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);

    return cA;
  }